

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.h
# Opt level: O0

bool __thiscall glslang::TQualifier::isArrayedIo(TQualifier *this,EShLanguage language)

{
  bool bVar1;
  bool local_35;
  bool local_34;
  bool local_33;
  bool local_32;
  bool local_31;
  EShLanguage language_local;
  TQualifier *this_local;
  
  switch(language) {
  case EShLangTessControl:
    local_31 = false;
    if ((*(ulong *)&this->field_0x8 >> 0x2c & 1) == 0) {
      bVar1 = isPipeInput(this);
      local_32 = true;
      if (!bVar1) {
        local_32 = isPipeOutput(this);
      }
      local_31 = local_32;
    }
    this_local._7_1_ = local_31;
    break;
  case EShLangTessEvaluation:
    local_33 = false;
    if ((*(ulong *)&this->field_0x8 >> 0x2c & 1) == 0) {
      local_33 = isPipeInput(this);
    }
    this_local._7_1_ = local_33;
    break;
  case EShLangGeometry:
    this_local._7_1_ = isPipeInput(this);
    break;
  case EShLangFragment:
    if (((*(ulong *)&this->field_0x8 >> 0x27 & 1) != 0) ||
       (local_34 = false, (*(ulong *)&this->field_0x8 >> 0x28 & 1) != 0)) {
      local_34 = isPipeInput(this);
    }
    this_local._7_1_ = local_34;
    break;
  default:
    this_local._7_1_ = false;
    break;
  case EShLangMesh:
    local_35 = false;
    if ((*(ulong *)&this->field_0x8 >> 0x2b & 1) == 0) {
      local_35 = isPipeOutput(this);
    }
    this_local._7_1_ = local_35;
  }
  return this_local._7_1_;
}

Assistant:

bool isArrayedIo(EShLanguage language) const
    {
        switch (language) {
        case EShLangGeometry:
            return isPipeInput();
        case EShLangTessControl:
            return ! patch && (isPipeInput() || isPipeOutput());
        case EShLangTessEvaluation:
            return ! patch && isPipeInput();
        case EShLangFragment:
            return (pervertexNV || pervertexEXT) && isPipeInput();
        case EShLangMesh:
            return ! perTaskNV && isPipeOutput();

        default:
            return false;
        }
    }